

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapetetra.cpp
# Opt level: O1

void pzshape::TPZShapeTetra::TransformDerivativeFromFaceToTetra
               (int face,int num,TPZFMatrix<double> *dphi)

{
  double dVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  
  if (0 < num) {
    lVar6 = (long)face * 0x30;
    uVar5 = 0;
    do {
      if (((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 1) ||
         ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= (long)uVar5)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      lVar2 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
      if ((lVar2 < 2) || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= (long)uVar5))
      {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      lVar3 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
      if ((lVar3 < 3) || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= (long)uVar5))
      {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      lVar4 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
      dphi->fElem[lVar4 * uVar5 + 2] =
           *(double *)(gFaceTrans3dTetra2d + lVar6 + 0x10) * dphi->fElem[lVar2 * uVar5] +
           *(double *)(gFaceTrans3dTetra2d + lVar6 + 0x28) * dphi->fElem[lVar3 * uVar5 + 1];
      if ((lVar4 < 2) || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= (long)uVar5))
      {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      lVar2 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
      dVar1 = dphi->fElem[lVar2 * uVar5 + 1];
      if ((lVar2 < 1) || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= (long)uVar5))
      {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      lVar2 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
      if ((lVar2 < 2) || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= (long)uVar5))
      {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      lVar3 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
      if ((lVar3 < 2) || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= (long)uVar5))
      {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      lVar4 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
      dphi->fElem[lVar4 * uVar5 + 1] =
           *(double *)(gFaceTrans3dTetra2d + lVar6 + 8) * dphi->fElem[lVar2 * uVar5] +
           *(double *)(gFaceTrans3dTetra2d + lVar6 + 0x20) * dphi->fElem[lVar3 * uVar5 + 1];
      if ((lVar4 < 1) || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= (long)uVar5))
      {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      lVar2 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
      if ((lVar2 < 1) || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= (long)uVar5))
      {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      dphi->fElem[(dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * uVar5] =
           *(double *)(gFaceTrans3dTetra2d + lVar6) * dphi->fElem[lVar2 * uVar5] +
           dVar1 * *(double *)(gFaceTrans3dTetra2d + lVar6 + 0x18);
      uVar5 = uVar5 + 1;
    } while ((uint)num != uVar5);
  }
  return;
}

Assistant:

void TPZShapeTetra::TransformDerivativeFromFaceToTetra(int face,int num,TPZFMatrix<REAL> &dphi) {
		
		for (int j = 0;j<num;j++) {
			dphi(2,j) = gFaceTrans3dTetra2d[face][0][2]*dphi(0,j)+gFaceTrans3dTetra2d[face][1][2]*dphi(1,j);
			REAL dphi1j = dphi(1,j);
			dphi(1,j) = gFaceTrans3dTetra2d[face][0][1]*dphi(0,j)+gFaceTrans3dTetra2d[face][1][1]*dphi(1,j);
			dphi(0,j) = gFaceTrans3dTetra2d[face][0][0]*dphi(0,j)+gFaceTrans3dTetra2d[face][1][0]*dphi1j;//dphi(1,j);
		}
	}